

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall
TestOutput::printErrorInFileOnLineFormattedForWorkingEnvironment
          (TestOutput *this,SimpleString *file,size_t lineNumber)

{
  WorkingEnvironment WVar1;
  SimpleString local_50 [2];
  SimpleString local_30;
  size_t local_20;
  size_t lineNumber_local;
  SimpleString *file_local;
  TestOutput *this_local;
  
  local_20 = lineNumber;
  lineNumber_local = (size_t)file;
  file_local = (SimpleString *)this;
  WVar1 = getWorkingEnvironment();
  if (WVar1 == visualStudio) {
    SimpleString::SimpleString(&local_30,file);
    (*this->_vptr_TestOutput[0x15])(this,&local_30,local_20);
    SimpleString::~SimpleString(&local_30);
  }
  else {
    SimpleString::SimpleString(local_50,file);
    (*this->_vptr_TestOutput[0x14])(this,local_50,local_20);
    SimpleString::~SimpleString(local_50);
  }
  return;
}

Assistant:

void TestOutput::printErrorInFileOnLineFormattedForWorkingEnvironment(SimpleString file, size_t lineNumber)
{
    if (TestOutput::getWorkingEnvironment() == TestOutput::visualStudio)
        printVisualStudioErrorInFileOnLine(file, lineNumber);
    else
        printEclipseErrorInFileOnLine(file, lineNumber);
}